

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O2

string * __thiscall
duckdb::string_t::GetString_abi_cxx11_(string *__return_storage_ptr__,string_t *this)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = (ulong)(this->value).pointer.length;
  if (uVar1 < 0xd) {
    pcVar2 = (this->value).pointer.prefix;
  }
  else {
    pcVar2 = (this->value).pointer.ptr;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  return __return_storage_ptr__;
}

Assistant:

string GetString() const {
		return string(GetData(), GetSize());
	}